

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,char **it)

{
  int iVar1;
  char *__dest;
  undefined1 *puVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ptrdiff_t _Num;
  size_t __n;
  bool bVar12;
  char_type buffer [13];
  undefined1 local_3d [13];
  
  __dest = *it;
  uVar10 = *(uint *)this;
  iVar1 = *(int *)(this + 4);
  __n = (size_t)iVar1;
  puVar2 = local_3d + __n;
  if (uVar10 < 100) {
    bVar12 = false;
  }
  else {
    iVar5 = -1;
    uVar7 = 1;
    iVar8 = -2;
    uVar9 = 2;
    do {
      uVar4 = uVar10;
      uVar11 = (ulong)((uVar4 % 100) * 2);
      puVar2[-1] = internal::basic_data<void>::DIGITS[uVar11 + 1];
      lVar6 = -1;
      if ((uVar7 / 3) * 3 + iVar5 == 0) {
        *(num_writer *)(puVar2 + -2) = this[8];
        lVar6 = -2;
      }
      puVar2[lVar6 + -1] = internal::basic_data<void>::DIGITS[uVar11];
      if ((int)(uVar9 / 3) * 3 + iVar8 == 0) {
        *(num_writer *)(puVar2 + lVar6 + -2) = this[8];
        lVar6 = lVar6 + -2;
      }
      else {
        lVar6 = lVar6 + -1;
      }
      puVar2 = puVar2 + lVar6;
      iVar5 = iVar5 + -2;
      uVar7 = uVar7 + 2;
      iVar8 = iVar8 + -2;
      uVar9 = (ulong)((int)uVar9 + 2);
      uVar10 = uVar4 / 100;
    } while (9999 < uVar4);
    bVar12 = iVar5 + (uVar7 / 3) * 3 == 0;
    uVar10 = uVar4 / 100;
  }
  if (uVar10 < 10) {
    bVar3 = (byte)uVar10 | 0x30;
  }
  else {
    puVar2[-1] = internal::basic_data<void>::DIGITS[((ulong)uVar10 * 2 & 0xffffffff) + 1];
    lVar6 = -1;
    if (bVar12) {
      *(num_writer *)(puVar2 + -2) = this[8];
      lVar6 = -2;
    }
    puVar2 = puVar2 + lVar6;
    bVar3 = internal::basic_data<void>::DIGITS[(ulong)uVar10 * 2];
  }
  puVar2[-1] = bVar3;
  if (iVar1 != 0) {
    memcpy(__dest,local_3d,__n);
  }
  *it = __dest + __n;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }